

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxArrayElement::Emit(FxArrayElement *this,VMFunctionBuilder *build)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpEmit local_78;
  ExpEmit temp_1;
  ExpEmit indexwork;
  int shiftbits;
  ExpEmit indexv;
  ExpEmit temp;
  undefined1 local_48 [28];
  uint indexval;
  ExpEmit start;
  PArray *arraytype;
  VMFunctionBuilder *build_local;
  FxArrayElement *this_local;
  ExpEmit dest;
  
  if ((this->arrayispointer & 1U) == 0) {
    start = (ExpEmit)this->Array->ValueType;
  }
  else {
    start = (ExpEmit)this->Array->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject;
  }
  iVar1 = (*this->Array->_vptr_FxExpression[9])(this->Array,build);
  register0x00000000 = (PType *)CONCAT44(extraout_var,iVar1);
  uVar2 = (*this->index->_vptr_FxExpression[3])();
  if ((uVar2 & 1) == 0) {
    indexwork._4_4_ = (*this->index->_vptr_FxExpression[9])(this->index,build);
    register0x00000004 = (bool)(char)extraout_var_00;
    register0x00000005 = (bool)(char)((uint)extraout_var_00 >> 8);
    register0x00000006 = (bool)(char)((uint)extraout_var_00 >> 0x10);
    register0x00000007 = (bool)(char)((uint)extraout_var_00 >> 0x18);
    if (*(uint *)((long)start + 0xa0) < 0x10000) {
      VMFunctionBuilder::Emit
                (build,0x54,indexwork._4_4_ & 0xffff,(VM_SHALF)*(undefined4 *)((long)start + 0xa0));
    }
    else {
      uVar2 = indexwork._4_4_ & 0xffff;
      uVar3 = VMFunctionBuilder::GetConstantInt(build,*(int *)((long)start + 0xa0));
      VMFunctionBuilder::Emit(build,0x55,uVar2,(VM_SHALF)uVar3);
    }
    if (((ulong)stack0xffffffffffffffd0 & 0x100000000) == 0) {
      indexwork.RegNum = 0;
      indexwork.RegType = '\0';
      indexwork.RegCount = '\0';
      for (; (uint)(1 << ((byte)indexwork.RegNum & 0x1f)) < *(uint *)((long)start + 0xa4);
          indexwork._0_4_ = indexwork._0_4_ + 1) {
      }
      if ((((ulong)stack0xffffffffffffff9c & 0x10000000000) == 0) ||
         (*(uint *)((long)start + 0xa4) < 2)) {
        temp_1 = stack0xffffffffffffff9c;
      }
      else {
        ExpEmit::ExpEmit(&temp_1,build,(uint)indexwork.Final,1);
      }
      if (1 << ((byte)indexwork.RegNum & 0x1f) == *(int *)((long)start + 0xa4)) {
        if (0 < (int)indexwork._0_4_) {
          VMFunctionBuilder::Emit
                    (build,0x5b,(uint)temp_1.RegNum,(uint)(ushort)indexwork._4_2_,indexwork._0_4_);
        }
      }
      else {
        uVar2 = (uint)temp_1.RegNum;
        uVar3 = (uint)(ushort)indexwork._4_2_;
        uVar4 = VMFunctionBuilder::GetConstantInt(build,*(int *)((long)start + 0xa4));
        VMFunctionBuilder::Emit(build,0x6a,uVar2,uVar3,uVar4);
      }
      ExpEmit::Free(&temp_1,build);
      if ((this->AddressRequested & 1U) == 0) {
        ExpEmit::Free((ExpEmit *)(local_48 + 0x18),build);
        iVar1 = PType::GetRegType((this->super_FxExpression).ValueType);
        ExpEmit::ExpEmit((ExpEmit *)&this_local,build,iVar1,1);
        iVar1 = PType::GetLoadOp(*(PType **)((long)start + 0x98));
        VMFunctionBuilder::Emit
                  (build,iVar1 + 1,(uint)(ushort)this_local,(uint)(ushort)local_48._24_2_,
                   (uint)temp_1.RegNum);
      }
      else {
        if (((ulong)stack0xffffffffffffffd0 & 0x10000000000) == 0) {
          VMFunctionBuilder::Emit
                    (build,0xcc,(uint)(ushort)local_48._24_2_,(uint)(ushort)local_48._24_2_,
                     (uint)temp_1.RegNum);
        }
        else {
          ExpEmit::Free((ExpEmit *)(local_48 + 0x18),build);
          ExpEmit::ExpEmit(&local_78,build,(uint)local_48[0x1a],1);
          VMFunctionBuilder::Emit
                    (build,0xcc,(uint)local_78.RegNum,(uint)(ushort)local_48._24_2_,
                     (uint)temp_1.RegNum);
          unique0x10000382 = (PType *)CONCAT62(local_78._2_6_,local_78.RegNum);
        }
        this_local = (FxArrayElement *)stack0xffffffffffffffd0;
      }
    }
    else {
      uVar3 = (uint)local_48[0x1a];
      uVar2 = PType::GetRegType((this->super_FxExpression).ValueType);
      if (uVar3 != uVar2) {
        __assert_fail("start.RegType == ValueType->GetRegType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1ae5,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
      }
      ExpEmit::ExpEmit((ExpEmit *)&this_local,build,(uint)local_48[0x1a],1);
      if ((ushort)local_48._24_2_ < 0x100) {
        VMFunctionBuilder::Emit
                  (build,Emit::LKR_Ops[(ulong)stack0xffffffffffffffd0 >> 0x10 & 0xff],
                   (uint)(ushort)this_local,(uint)(ushort)indexwork._4_2_,
                   (uint)(ushort)local_48._24_2_);
      }
      else {
        uVar2 = (uint)(ushort)indexwork._4_2_;
        uVar3 = (uint)(ushort)indexwork._4_2_;
        uVar4 = VMFunctionBuilder::GetConstantInt(build,(uint)(ushort)local_48._24_2_);
        VMFunctionBuilder::Emit(build,100,uVar2,uVar3,uVar4);
        VMFunctionBuilder::Emit
                  (build,Emit::LKR_Ops[(ulong)stack0xffffffffffffffd0 >> 0x10 & 0xff],
                   (uint)(ushort)this_local,(uint)(ushort)indexwork._4_2_,0);
      }
      ExpEmit::Free((ExpEmit *)&indexwork.Konst,build);
    }
  }
  else {
    FxConstant::GetValue((FxConstant *)local_48);
    uVar2 = ExpVal::GetInt((ExpVal *)local_48);
    ExpVal::~ExpVal((ExpVal *)local_48);
    local_48._20_4_ = uVar2;
    if (*(uint *)((long)start + 0xa0) <= uVar2) {
      __assert_fail("indexval < arraytype->ElementCount && \"Array index out of bounds\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x1a7f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
    }
    if ((this->AddressRequested & 1U) == 0) {
      if (((ulong)stack0xffffffffffffffd0 & 0x100000000) == 0) {
        ExpEmit::Free((ExpEmit *)(local_48 + 0x18),build);
        iVar1 = PType::GetRegType((this->super_FxExpression).ValueType);
        ExpEmit::ExpEmit((ExpEmit *)&this_local,build,iVar1,1);
        iVar1 = PType::GetLoadOp(*(PType **)((long)start + 0x98));
        uVar2 = (uint)(ushort)this_local;
        uVar3 = (uint)(ushort)local_48._24_2_;
        uVar4 = VMFunctionBuilder::GetConstantInt
                          (build,local_48._20_4_ * *(int *)((long)start + 0xa4));
        VMFunctionBuilder::Emit(build,iVar1,uVar2,uVar3,uVar4);
      }
      else {
        uVar3 = (uint)local_48[0x1a];
        uVar2 = PType::GetRegType((this->super_FxExpression).ValueType);
        if (uVar3 != uVar2) {
          __assert_fail("start.RegType == ValueType->GetRegType()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0x1a9f,"virtual ExpEmit FxArrayElement::Emit(VMFunctionBuilder *)");
        }
        ExpEmit::ExpEmit((ExpEmit *)&this_local,build,(uint)local_48[0x1a],1);
        VMFunctionBuilder::Emit
                  (build,Emit::LK_Ops[(ulong)stack0xffffffffffffffd0 >> 0x10 & 0xff],
                   (uint)(ushort)this_local,local_48._24_2_ + (short)local_48._20_4_);
      }
    }
    else {
      if (uVar2 != 0) {
        local_48._20_4_ = *(int *)((long)start + 0xa4) * uVar2;
        if (((ulong)stack0xffffffffffffffd0 & 0x10000000000) == 0) {
          uVar2 = (uint)(ushort)local_48._24_2_;
          uVar3 = (uint)(ushort)local_48._24_2_;
          uVar4 = VMFunctionBuilder::GetConstantInt(build,local_48._20_4_);
          VMFunctionBuilder::Emit(build,0xcd,uVar2,uVar3,uVar4);
        }
        else {
          ExpEmit::ExpEmit(&indexv,build,(uint)local_48[0x1a],1);
          uVar2 = (uint)indexv.RegNum;
          uVar3 = (uint)(ushort)local_48._24_2_;
          uVar4 = VMFunctionBuilder::GetConstantInt(build,local_48._20_4_);
          VMFunctionBuilder::Emit(build,0xcd,uVar2,uVar3,uVar4);
          ExpEmit::Free((ExpEmit *)(local_48 + 0x18),build);
          unique0x1000038a = (PType *)CONCAT62(indexv._2_6_,indexv.RegNum);
        }
      }
      this_local = (FxArrayElement *)stack0xffffffffffffffd0;
    }
  }
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxArrayElement::Emit(VMFunctionBuilder *build)
{
	PArray *arraytype;
	
	if (arrayispointer)
	{
		arraytype = static_cast<PArray*>(static_cast<PPointer*>(Array->ValueType)->PointedType);
	}
	else
	{
		arraytype = static_cast<PArray*>(Array->ValueType);
	}
	ExpEmit start = Array->Emit(build);

	/* what was this for?
	if (start.Konst)
	{
		ExpEmit tmpstart(build, REGT_POINTER);
		build->Emit(OP_LKP, tmpstart.RegNum, start.RegNum);
		start.Free(build);
		start = tmpstart;
	}
	*/
	if (index->isConstant())
	{
		unsigned indexval = static_cast<FxConstant *>(index)->GetValue().GetInt();
		assert(indexval < arraytype->ElementCount && "Array index out of bounds");

		if (AddressRequested)
		{
			if (indexval != 0)
			{
				indexval *= arraytype->ElementSize;
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RK, start.RegNum, start.RegNum, build->GetConstantInt(indexval));
				}
				else
				{
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RK, temp.RegNum, start.RegNum, build->GetConstantInt(indexval));
					start.Free(build);
					start = temp;
				}
			}
			return start;
		}
		else if (!start.Konst)
		{
			start.Free(build);
			ExpEmit dest(build, ValueType->GetRegType());
			build->Emit(arraytype->ElementType->GetLoadOp(), dest.RegNum, start.RegNum, build->GetConstantInt(indexval* arraytype->ElementSize));
			return dest;
		}
		else
		{
			static int LK_Ops[] = { OP_LK, OP_LKF, OP_LKS, OP_LKP };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			build->Emit(LK_Ops[start.RegType], dest.RegNum, start.RegNum + indexval);
			return dest;
		}
	}
	else
	{
		ExpEmit indexv(index->Emit(build));
		// Todo: For dynamically allocated arrays (like global sector and linedef tables) we need to get the bound value in here somehow.
		// Right now their bounds are not properly checked for.
		if (arraytype->ElementCount > 65535)
		{
			build->Emit(OP_BOUND_K, indexv.RegNum, build->GetConstantInt(arraytype->ElementCount));
		}
		else
		{
			build->Emit(OP_BOUND, indexv.RegNum, arraytype->ElementCount);
		}

		if (!start.Konst)
		{
			int shiftbits = 0;
			while (1u << shiftbits < arraytype->ElementSize)
			{
				shiftbits++;
			}
			ExpEmit indexwork = indexv.Fixed && arraytype->ElementSize > 1 ? ExpEmit(build, indexv.RegType) : indexv;
			if (1u << shiftbits == arraytype->ElementSize)
			{
				if (shiftbits > 0)
				{
					build->Emit(OP_SLL_RI, indexwork.RegNum, indexv.RegNum, shiftbits);
				}
			}
			else
			{
				// A shift won't do, so use a multiplication
				build->Emit(OP_MUL_RK, indexwork.RegNum, indexv.RegNum, build->GetConstantInt(arraytype->ElementSize));
			}
			indexwork.Free(build);

			if (AddressRequested)
			{
				if (!start.Fixed)
				{
					build->Emit(OP_ADDA_RR, start.RegNum, start.RegNum, indexwork.RegNum);
				}
				else
				{
					start.Free(build);
					// do not clobber local variables.
					ExpEmit temp(build, start.RegType);
					build->Emit(OP_ADDA_RR, temp.RegNum, start.RegNum, indexwork.RegNum);
					start = temp;
				}
				return start;
			}
			else
			{
				start.Free(build);
				ExpEmit dest(build, ValueType->GetRegType());
				// added 1 to use the *_R version that takes the offset from a register
				build->Emit(arraytype->ElementType->GetLoadOp() + 1, dest.RegNum, start.RegNum, indexwork.RegNum);
				return dest;
			}
		}
		else
		{
			static int LKR_Ops[] = { OP_LK_R, OP_LKF_R, OP_LKS_R, OP_LKP_R };
			assert(start.RegType == ValueType->GetRegType());
			ExpEmit dest(build, start.RegType);
			if (start.RegNum <= 255)
			{
				// Since large constant tables are the exception, the constant component in C is an immediate value here.
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, start.RegNum);
			}
			else
			{
				build->Emit(OP_ADD_RK, indexv.RegNum, indexv.RegNum, build->GetConstantInt(start.RegNum));
				build->Emit(LKR_Ops[start.RegType], dest.RegNum, indexv.RegNum, 0);
			}
			indexv.Free(build);
			return dest;
		}
	}
}